

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

__m128i highbd_filter_block_2rows(__m128i *a0,__m128i *b0,__m128i *a1,__m128i *b1,__m128i *filter)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 (*in_R8) [16];
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i alVar7;
  __m128i v_val_d;
  __m128i v_val_d_00;
  __m128i v1;
  __m128i v0;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined2 local_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined2 local_58;
  undefined2 uStack_56;
  undefined2 uStack_54;
  undefined2 uStack_52;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined2 local_38;
  undefined2 uStack_36;
  undefined2 uStack_34;
  undefined2 uStack_32;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RSI;
  local_38 = (undefined2)uVar1;
  uStack_36 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_34 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_32 = (undefined2)((ulong)uVar1 >> 0x30);
  local_48 = (undefined2)uVar2;
  uStack_46 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_44 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_42 = (undefined2)((ulong)uVar2 >> 0x30);
  local_e8._0_4_ = CONCAT22(local_48,local_38);
  local_e8._0_6_ = CONCAT24(uStack_36,(undefined4)local_e8);
  local_e8 = CONCAT26(uStack_46,(undefined6)local_e8);
  uStack_e0._0_2_ = uStack_34;
  uStack_e0._2_2_ = uStack_44;
  uStack_e0._4_2_ = uStack_32;
  uStack_e0._6_2_ = uStack_42;
  auVar4._8_8_ = uStack_e0;
  auVar4._0_8_ = local_e8;
  pmaddwd(auVar4,*in_R8);
  v_val_d[1] = (longlong)in_RSI;
  v_val_d[0] = 7;
  alVar7 = xx_roundn_epu32(v_val_d,(int)in_RDX);
  uVar1 = *in_RDX;
  uVar2 = *in_RCX;
  local_58 = (undefined2)uVar1;
  uStack_56 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_54 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_52 = (undefined2)((ulong)uVar1 >> 0x30);
  local_68 = (undefined2)uVar2;
  uStack_66 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_64 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_62 = (undefined2)((ulong)uVar2 >> 0x30);
  local_f8._0_4_ = CONCAT22(local_68,local_58);
  local_f8._0_6_ = CONCAT24(uStack_56,(undefined4)local_f8);
  local_f8 = CONCAT26(uStack_66,(undefined6)local_f8);
  uStack_f0._0_2_ = uStack_54;
  uStack_f0._2_2_ = uStack_64;
  uStack_f0._4_2_ = uStack_52;
  uStack_f0._6_2_ = uStack_62;
  auVar3._8_8_ = uStack_f0;
  auVar3._0_8_ = local_f8;
  pmaddwd(auVar3,*in_R8);
  v_val_d_00[1] = (longlong)in_RSI;
  v_val_d_00[0] = 7;
  alVar7 = xx_roundn_epu32(v_val_d_00,(int)alVar7[1]);
  auVar6._8_8_ = extraout_XMM0_Qb;
  auVar6._0_8_ = extraout_XMM0_Qa;
  auVar5._8_8_ = extraout_XMM0_Qb_00;
  auVar5._0_8_ = extraout_XMM0_Qa_00;
  packssdw(auVar6,auVar5);
  alVar7[0] = alVar7[0];
  alVar7[1] = alVar7[1];
  return alVar7;
}

Assistant:

static inline __m128i highbd_filter_block_2rows(const __m128i *a0,
                                                const __m128i *b0,
                                                const __m128i *a1,
                                                const __m128i *b1,
                                                const __m128i *filter) {
  __m128i v0 = _mm_unpacklo_epi16(*a0, *b0);
  v0 = _mm_madd_epi16(v0, *filter);
  v0 = xx_roundn_epu32(v0, FILTER_BITS);

  __m128i v1 = _mm_unpacklo_epi16(*a1, *b1);
  v1 = _mm_madd_epi16(v1, *filter);
  v1 = xx_roundn_epu32(v1, FILTER_BITS);

  return _mm_packs_epi32(v0, v1);
}